

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  code *pcVar2;
  long lVar3;
  long *__nptr;
  uint uVar4;
  int *piVar5;
  char **ppcVar6;
  undefined8 uVar7;
  thread *t;
  long lVar8;
  long lVar9;
  char___0_ *__range1_1;
  long lVar10;
  thread (*__range1) [33242];
  void *__s;
  ulong uVar11;
  long lStack_1a0;
  long lStack_198;
  undefined1 local_190 [8];
  Database tpch;
  long *local_78 [2];
  long local_68 [2];
  ulong local_58;
  long *local_50;
  char **local_48;
  char **argv_local;
  uint local_38;
  int local_34;
  int round;
  int thread_num;
  
  lStack_1a0 = 0x1039ac;
  local_48 = argv;
  mkdir(DATA_PATH_abi_cxx11_._M_dataplus._M_p,0x1ff);
  tpch.a_lineitemposition[4]._0_1_ = '\0';
  lStack_1a0 = 0x1039cf;
  Database::importDB((Database *)local_190,local_48[1],local_48[2],local_48[3]);
  lStack_1a0 = 0x1039e4;
  std::__cxx11::string::string((string *)local_78,local_48[4],(allocator *)&local_34);
  __nptr = local_78[0];
  lStack_1a0 = 0x1039ed;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lStack_1a0 = 0x103a0d;
  ppcVar6 = (char **)strtol((char *)__nptr,(char **)&local_50,10);
  if (local_50 == __nptr) {
    lStack_1a0 = 0x103be9;
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar4 = (uint)ppcVar6;
    if (((char **)(long)(int)uVar4 == ppcVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      if (local_78[0] != local_68) {
        lStack_1a0 = 0x103a51;
        operator_delete(local_78[0],local_68[0] + 1);
      }
      tpch._264_8_ = &lStack_198;
      uVar11 = 0x10;
      if ((int)uVar4 < 0x10) {
        uVar11 = (ulong)ppcVar6 & 0xffffffff;
      }
      local_38 = uVar4;
      local_34 = (int)uVar11;
      lVar3 = -(uVar11 * 8 + 0xf & 0xfffffffffffffff0);
      __s = (void *)((long)&lStack_198 + lVar3);
      argv_local = ppcVar6;
      if (uVar4 != 0) {
        *(undefined8 *)((long)&lStack_1a0 + lVar3) = 0x103a9b;
        memset(__s,0,uVar11 * 8);
      }
      local_58 = (ulong)local_38;
      lVar10 = (long)__s - ((ulong)local_38 * 8 + 0xf & 0xfffffffffffffff0);
      if (0 < local_34) {
        lVar8 = 0;
        do {
          local_50 = (long *)0x0;
          *(undefined8 *)(lVar10 + -8) = 0x103adc;
          local_78[0] = (long *)operator_new(0x40);
          *local_78[0] = (long)&PTR___State_00107d48;
          *(int *)(local_78[0] + 1) = (int)lVar8;
          local_78[0][2] = (long)&local_38;
          local_78[0][3] = (long)&local_34;
          local_78[0][4] = (long)&local_48;
          local_78[0][5] = local_58;
          local_78[0][6] = lVar10;
          local_78[0][7] = (long)local_190;
          *(undefined8 *)(lVar10 + -8) = 0x103b24;
          std::thread::_M_start_thread(&local_50,local_78,0);
          if (local_78[0] != (long *)0x0) {
            pcVar2 = *(code **)(*local_78[0] + 8);
            *(undefined8 *)(lVar10 + -8) = 0x103b33;
            (*pcVar2)();
          }
          if (*(long *)((long)__s + lVar8 * 8) != 0) goto LAB_00103c6d;
          *(long **)((long)__s + lVar8 * 8) = local_50;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_34);
      }
      if ((int)argv_local != 0) {
        lVar8 = uVar11 * 8;
        do {
          *(undefined8 *)(lVar10 + -8) = 0x103b6f;
          std::thread::join();
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      if (local_58 != 0) {
        lVar8 = local_58 << 3;
        lVar9 = 0;
        do {
          uVar7 = *(undefined8 *)(lVar10 + lVar9);
          *(undefined8 *)(lVar10 + -8) = 0x103b9c;
          printf("%s",uVar7);
          lVar9 = lVar9 + 8;
        } while (lVar8 != lVar9);
      }
      if ((int)argv_local != 0) {
        lVar8 = uVar11 << 3;
        do {
          if (*(long *)((long)&lStack_1a0 + lVar8 + lVar3) != 0) {
LAB_00103c6d:
            *(code **)(lVar10 + -8) =
                 std::thread::
                 _State_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hezuojiao[P]bigdata_race/src/Database.h:245:32)>_>_>
                 ::~_State_impl;
            std::terminate();
          }
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      do {
      } while ((char)tpch.a_lineitemposition[4] != '\0');
      return 0;
    }
  }
  lStack_1a0 = 0x103bf5;
  uVar7 = std::__throw_out_of_range("stoi");
  do {
  } while ((char)tpch.a_lineitemposition[4] != '\0');
  lStack_1a0 = 0x103c6d;
  _Unwind_Resume(uVar7);
}

Assistant:

int main(int argc, char* argv[]) {

  mkdir(DATA_PATH.c_str(), 0777);

  Database tpch;

  // load
  tpch.importDB(argv[1], argv[2], argv[3]);

  auto round = std::stoi(argv[4]);
  auto thread_num = std::min(MAX_CORE_NUM, round);
  std::thread threads[thread_num];
  char* results[round];

  // query
  for (int i = 0; i < thread_num; i++) {
    threads[i] = std::thread([&, i]{
      for (int round_id = i; round_id < round; round_id += thread_num) {
        auto mktsegmentCondition = argv[5 + round_id * 4][0];
        auto orderdateCondition = util::DateToInt(argv[5 + round_id * 4 + 1]);
        auto shipdateCondition = util::DateToInt(argv[5 + round_id * 4 + 2]);
        auto topn = std::stoi(argv[5 + round_id * 4 + 3]);
        results[round_id] = tpch.query(mktsegmentCondition, orderdateCondition, shipdateCondition, topn);
      }
    });
  }

  for (auto &t : threads) {
    t.join();
  }

  for (auto &r : results) {
    printf("%s", r);
  }

  return 0;
}